

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O1

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)10>::Move_iterator::find_next
          (Move_iterator *this,Size_t from)

{
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex;
  pointer puVar2;
  __uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_> _Var3;
  ulong uVar4;
  _Base_ptr p_Var5;
  int iVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  Size_t SVar9;
  Size_t SVar10;
  Widget *local_30;
  
  __mutex = (pthread_mutex_t *)this->mtx_;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  SVar9 = (long)(this->events_->
                super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->events_->
                super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  if ((SVar9 != from) && (SVar10 = from + 1, from = SVar10, SVar10 != SVar9)) {
    p_Var1 = &(this->already_sent_)._M_t._M_impl.super__Rb_tree_header;
    do {
      puVar2 = (this->events_->
               super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
      super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl =
           puVar2[SVar10]._M_t.
           super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t;
      if ((_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
          _Var3._M_t.
          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
          super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl != (Event *)0x0) {
        uVar4 = *(ulong *)((long)_Var3._M_t.
                                 super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                                 .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl +
                          0x10);
        p_Var5 = (this->already_sent_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
            p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar4]) {
          if (*(ulong *)(p_Var5 + 1) >= uVar4) {
            p_Var7 = p_Var5;
          }
        }
        p_Var8 = p_Var1;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var8 = (_Rb_tree_header *)p_Var7, uVar4 < ((_Rb_tree_header *)p_Var7)->_M_node_count))
        {
          p_Var8 = p_Var1;
        }
        if (p_Var8 == p_Var1) {
          local_30 = *(Widget **)
                      ((long)(this->events_->
                             super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[SVar10]._M_t.
                             super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>
                             ._M_t + 0x10);
          std::
          _Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
          ::_M_insert_unique<cppurses::Widget*>
                    ((_Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
                      *)&this->already_sent_,&local_30);
          from = SVar10;
          break;
        }
        puVar2[SVar10]._M_t.
        super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t =
             (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)0x0;
        (**(code **)(*(long *)_Var3._M_t.
                              super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                              .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 8))();
      }
      SVar10 = SVar10 + 1;
      from = SVar9;
    } while (SVar10 != SVar9);
  }
  pthread_mutex_unlock(__mutex);
  return from;
}

Assistant:

inline auto Event_queue::View<Event::Paint>::Move_iterator::find_next(
    Size_t from) -> Size_t
{
    Guard_t g{mtx_};
    const auto end = events_.size();
    if (from == end)
        return from;
    while (++from != end) {
        if (events_[from] == nullptr)
            continue;
        if (already_sent_.count(&(events_[from]->receiver())) > 0) {
            events_[from].reset(nullptr);
            continue;
        }
        already_sent_.insert(&(events_[from]->receiver()));
        break;
    }
    return from;
}